

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

pair<const_char_*,_bool> __thiscall
google::protobuf::internal::EpsCopyInputStream::DoneFallback
          (EpsCopyInputStream *this,char *ptr,int d)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  undefined8 unaff_RBP;
  ulong uVar4;
  int overrun;
  pair<const_char_*,_bool> pVar5;
  
  overrun = (int)ptr - *(int *)&this->buffer_end_;
  uVar4 = CONCAT71((int7)((ulong)unaff_RBP >> 8),1);
  if (this->limit_ < overrun) {
LAB_0025b3b5:
    ptr = (char *)0x0;
  }
  else {
    do {
      pcVar1 = Next(this,overrun,d);
      if (pcVar1 == (char *)0x0) {
        if (overrun != 0) goto LAB_0025b3b5;
        this->limit_end_ = this->buffer_end_;
        this->last_tag_minus_1_ = 1;
        goto LAB_0025b3a7;
      }
      iVar2 = (int)this->buffer_end_;
      uVar3 = ((int)pcVar1 - iVar2) + this->limit_;
      this->limit_ = uVar3;
      ptr = pcVar1 + overrun;
      overrun = (int)ptr - iVar2;
    } while (-1 < overrun);
    this->limit_end_ = this->buffer_end_ + (int)((int)uVar3 >> 0x1f & uVar3);
    uVar4 = 0;
  }
LAB_0025b3a7:
  pVar5._8_8_ = uVar4 & 0xffffffff;
  pVar5.first = ptr;
  return pVar5;
}

Assistant:

std::pair<const char*, bool> EpsCopyInputStream::DoneFallback(const char* ptr,
                                                              int d) {
  GOOGLE_DCHECK(ptr >= limit_end_);
  int overrun = ptr - buffer_end_;
  GOOGLE_DCHECK(overrun <= kSlopBytes);  // Guaranteed by parse loop.
  // Did we exceeded the limit (parse error).
  if (PROTOBUF_PREDICT_FALSE(overrun > limit_)) return {nullptr, true};
  GOOGLE_DCHECK(overrun != limit_);  // Guaranteed by caller.
  GOOGLE_DCHECK(overrun < limit_);   // Follows from above
  // TODO(gerbens) Instead of this dcheck we could just assign, and remove
  // updating the limit_end from PopLimit, ie.
  // limit_end_ = buffer_end_ + (std::min)(0, limit_);
  // if (ptr < limit_end_) return {ptr, false};
  GOOGLE_DCHECK(limit_end_ == buffer_end_ + (std::min)(0, limit_));
  // At this point we know the following assertion holds.
  GOOGLE_DCHECK(limit_ > 0);
  GOOGLE_DCHECK(limit_end_ == buffer_end_);  // because limit_ > 0
  do {
    // We are past the end of buffer_end_, in the slop region.
    GOOGLE_DCHECK(overrun >= 0);
    auto p = Next(overrun, d);
    if (p == nullptr) {
      // We are at the end of the stream
      if (PROTOBUF_PREDICT_FALSE(overrun != 0)) return {nullptr, true};
      GOOGLE_DCHECK(limit_ > 0);
      limit_end_ = buffer_end_;
      // Distinquish ending on a pushed limit or ending on end-of-stream.
      SetEndOfStream();
      return {ptr, true};
    }
    limit_ -= buffer_end_ - p;  // Adjust limit_ relative to new anchor
    ptr = p + overrun;
    overrun = ptr - buffer_end_;
  } while (overrun >= 0);
  limit_end_ = buffer_end_ + std::min(0, limit_);
  return {ptr, false};
}